

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void rebuild(cubeb_conflict1 *ctx)

{
  long lVar1;
  void *pvVar2;
  long in_RDI;
  cubeb_stream_conflict1 *stm;
  nfds_t j;
  int i;
  nfds_t nfds;
  long local_20;
  int local_14;
  size_t local_10;
  
  if (*(int *)(in_RDI + 0xd0) == 0) {
    __assert_fail("ctx->rebuild",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0xf3,"void rebuild(cubeb *)");
  }
  local_10 = 1;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    lVar1 = *(long *)(in_RDI + 0x40 + (long)local_14 * 8);
    if ((lVar1 != 0) && (*(undefined8 *)(lVar1 + 0xc0) = 0, *(int *)(lVar1 + 0xb0) == 1)) {
      local_10 = *(long *)(lVar1 + 200) + local_10;
    }
  }
  free(*(void **)(in_RDI + 0xc0));
  pvVar2 = calloc(local_10,8);
  *(void **)(in_RDI + 0xc0) = pvVar2;
  if (*(long *)(in_RDI + 0xc0) == 0) {
    __assert_fail("ctx->fds",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x103,"void rebuild(cubeb *)");
  }
  *(size_t *)(in_RDI + 200) = local_10;
  **(undefined4 **)(in_RDI + 0xc0) = *(undefined4 *)(in_RDI + 0xd8);
  *(undefined2 *)(*(long *)(in_RDI + 0xc0) + 4) = 9;
  local_20 = 1;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    lVar1 = *(long *)(in_RDI + 0x40 + (long)local_14 * 8);
    if ((lVar1 != 0) && (*(int *)(lVar1 + 0xb0) == 1)) {
      memcpy((void *)(*(long *)(in_RDI + 0xc0) + local_20 * 8),*(void **)(lVar1 + 0xb8),
             *(long *)(lVar1 + 200) << 3);
      *(long *)(lVar1 + 0xc0) = *(long *)(in_RDI + 0xc0) + local_20 * 8;
      local_20 = *(long *)(lVar1 + 200) + local_20;
    }
  }
  *(undefined4 *)(in_RDI + 0xd0) = 0;
  return;
}

Assistant:

static void
rebuild(cubeb * ctx)
{
  nfds_t nfds;
  int i;
  nfds_t j;
  cubeb_stream * stm;

  assert(ctx->rebuild);

  /* Always count context's control pipe fd. */
  nfds = 1;
  for (i = 0; i < CUBEB_STREAM_MAX; ++i) {
    stm = ctx->streams[i];
    if (stm) {
      stm->fds = NULL;
      if (stm->state == RUNNING) {
        nfds += stm->nfds;
      }
    }
  }

  free(ctx->fds);
  ctx->fds = calloc(nfds, sizeof(struct pollfd));
  assert(ctx->fds);
  ctx->nfds = nfds;

  /* Include context's control pipe fd. */
  ctx->fds[0].fd = ctx->control_fd_read;
  ctx->fds[0].events = POLLIN | POLLERR;

  for (i = 0, j = 1; i < CUBEB_STREAM_MAX; ++i) {
    stm = ctx->streams[i];
    if (stm && stm->state == RUNNING) {
      memcpy(&ctx->fds[j], stm->saved_fds, stm->nfds * sizeof(struct pollfd));
      stm->fds = &ctx->fds[j];
      j += stm->nfds;
    }
  }

  ctx->rebuild = 0;
}